

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_number
          (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  semantic_tag sVar2;
  semantic_tag sVar3;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  bool local_1;
  
  jVar1 = storage_kind(in_RDI);
  this_00 = (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
            (ulong)(byte)(jVar1 - int64);
  switch(this_00) {
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x0:
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x1:
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x3:
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x4:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x5:
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0xd:
    sVar2 = tag((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                CONCAT17(in_stack_ffffffffffffffdf,
                         CONCAT16(in_stack_ffffffffffffffde,
                                  CONCAT15(in_stack_ffffffffffffffdd,
                                           CONCAT14(in_stack_ffffffffffffffdc,
                                                    in_stack_ffffffffffffffd8)))));
    local_1 = true;
    if (sVar2 != bigint) {
      sVar3 = tag((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                  CONCAT17(sVar2,CONCAT16(1,CONCAT15(in_stack_ffffffffffffffdd,
                                                     CONCAT14(in_stack_ffffffffffffffdc,
                                                              in_stack_ffffffffffffffd8)))));
      local_1 = true;
      if (sVar3 != bigdec) {
        sVar2 = tag((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                    CONCAT17(sVar2,CONCAT16(1,CONCAT15(sVar3,CONCAT14(in_stack_ffffffffffffffdc,
                                                                      in_stack_ffffffffffffffd8)))))
        ;
        local_1 = sVar2 == bigfloat;
      }
    }
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x6:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_const_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_const_reference_storage::value((json_const_reference_storage *)0x62195b);
    local_1 = is_number(this_00);
    break;
  case (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x7:
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_stack_ffffffffffffffd0);
    json_reference_storage::value((json_reference_storage *)0x621984);
    local_1 = is_number(this_00);
  }
  return local_1;
}

Assistant:

bool is_number() const noexcept
        {
            switch (storage_kind())
            {
                case json_storage_kind::int64:
                case json_storage_kind::uint64:
                case json_storage_kind::half_float:
                case json_storage_kind::float64:
                    return true;
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return tag() == semantic_tag::bigint ||
                           tag() == semantic_tag::bigdec ||
                           tag() == semantic_tag::bigfloat;
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().is_number();
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_number();
                default:
                    return false;
            }
        }